

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

Float __thiscall pbrt::LanczosSincFilter::Integral(LanczosSincFilter *this)

{
  Point2f *in_RDI;
  float y_00;
  float fVar1;
  Float FVar2;
  Point2f p;
  Point2f u;
  int x;
  int y;
  RNG rng;
  Float area;
  int nSamples;
  int sqrtSamples;
  Float sum;
  float in_stack_ffffffffffffffb0;
  Float in_stack_ffffffffffffffb4;
  LanczosSincFilter *in_stack_ffffffffffffffc0;
  Float local_38;
  Float local_34;
  int local_30;
  int local_2c;
  RNG local_28;
  float local_18;
  int local_14;
  int local_10;
  float local_c;
  
  local_c = 0.0;
  local_10 = 0x40;
  local_14 = 0x1000;
  local_18 = (in_RDI->super_Tuple2<pbrt::Point2,_float>).x * 2.0 * 2.0 *
             (in_RDI->super_Tuple2<pbrt::Point2,_float>).y;
  RNG::RNG(&local_28);
  for (local_2c = 0; local_2c < local_10; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
      y_00 = (float)local_30;
      fVar1 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0));
      in_stack_ffffffffffffffb0 = (y_00 + fVar1) / (float)local_10;
      fVar1 = (float)local_2c;
      RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 fVar1,y_00);
      in_stack_ffffffffffffffb4 =
           Lerp(local_38,-(in_RDI->super_Tuple2<pbrt::Point2,_float>).x,
                (in_RDI->super_Tuple2<pbrt::Point2,_float>).x);
      Lerp(local_34,-(in_RDI->super_Tuple2<pbrt::Point2,_float>).y,
           (in_RDI->super_Tuple2<pbrt::Point2,_float>).y);
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 fVar1,y_00);
      FVar2 = Evaluate(in_stack_ffffffffffffffc0,in_RDI);
      local_c = FVar2 + local_c;
    }
  }
  return (local_c / (float)local_14) * local_18;
}

Assistant:

Float LanczosSincFilter::Integral() const {
    Float sum = 0;
    int sqrtSamples = 64;
    int nSamples = sqrtSamples * sqrtSamples;
    Float area = 2 * radius.x * 2 * radius.y;
    RNG rng;
    for (int y = 0; y < sqrtSamples; ++y) {
        for (int x = 0; x < sqrtSamples; ++x) {
            Point2f u((x + rng.Uniform<Float>()) / sqrtSamples,
                      (y + rng.Uniform<Float>()) / sqrtSamples);
            Point2f p(Lerp(u.x, -radius.x, radius.x), Lerp(u.y, -radius.y, radius.y));
            sum += Evaluate(p);
        }
    }
    return sum / nSamples * area;
}